

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zz.h
# Opt level: O0

ZZ<8UL> * __thiscall GF2::ZZ<8UL>::operator-=(ZZ<8UL> *this,ZZ<8UL> *zRight)

{
  bool bVar1;
  ulong uVar2;
  word wVar3;
  WW<8UL> *in_RSI;
  WW<8UL> *in_RDI;
  size_t pos;
  word borrow;
  ulong local_18;
  
  local_18 = 0;
  bVar1 = false;
  while (!bVar1) {
    uVar2 = in_RDI->_words[0] - local_18;
    in_RDI->_words[0] = uVar2;
    if (-local_18 - 1 < uVar2) {
      wVar3 = WW<8UL>::GetWord(in_RSI,0);
      in_RDI->_words[0] = in_RDI->_words[0] - wVar3;
    }
    else {
      wVar3 = WW<8UL>::GetWord(in_RSI,0);
      uVar2 = in_RDI->_words[0] - wVar3;
      in_RDI->_words[0] = uVar2;
      wVar3 = WW<8UL>::GetWord(in_RSI,0);
      local_18 = (ulong)(-wVar3 - 1 < uVar2);
    }
    bVar1 = true;
  }
  WW<8UL>::Trim(in_RDI);
  return (ZZ<8UL> *)in_RDI;
}

Assistant:

ZZ& operator-=(const ZZ& zRight)
	{	
		word borrow = 0;
		for (size_t pos = 0; pos < _wcount; pos++)
			if ((_words[pos] -= borrow) > WORD_MAX - borrow) 
				_words[pos] -= zRight.GetWord(pos);
            else 
				borrow = (_words[pos] -= zRight.GetWord(pos)) > 
					WORD_MAX - zRight.GetWord(pos);
		Trim();
		return *this;
	}